

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayType.cpp
# Opt level: O0

void __thiscall
hdc::ArrayType::ArrayType(ArrayType *this,Type *subtype,Expression *expression,Token *token)

{
  Token *token_local;
  Expression *expression_local;
  Type *subtype_local;
  ArrayType *this_local;
  
  Type::Type(&this->super_Type);
  (this->super_Type).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_00220830;
  Token::Token(&this->token);
  this->subtype = subtype;
  this->expression = expression;
  Token::operator=(&this->token,token);
  ASTNode::setKind((ASTNode *)this,AST_ARRAY_TYPE);
  return;
}

Assistant:

ArrayType::ArrayType(Type *subtype, Expression *expression, Token &token) {
    this->subtype = subtype;
    this->expression = expression;
    this->token = token;
    setKind(AST_ARRAY_TYPE);
}